

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     call_far<unsigned_short,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (Instruction<false> *instruction,Context *context)

{
  ushort uVar1;
  Registers *pRVar2;
  Segments *pSVar3;
  ushort uVar4;
  type_conflict2 tVar5;
  type_conflict2 tVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  Source segment;
  uint16_t offset;
  type_conflict2 local_3c;
  ImmediateT local_3a;
  type_conflict2 local_38 [2];
  uint16_t local_34 [2];
  
  uVar1 = instruction->source_data_dest_sib_;
  uVar4 = "\x1f\x1f\x1f\x18"[uVar1 >> 3 & 3] & uVar1;
  if (uVar4 == 0xf) {
    local_34[0] = 0;
    local_34[1] = *(undefined2 *)
                   ((long)instruction->extensions_ + (ulong)(instruction->mem_exts_source_ >> 4 & 2)
                   );
    offset = *(uint16_t *)((long)local_34 + (ulong)(instruction->mem_exts_source_ >> 5 & 2));
  }
  else {
    uVar8 = uVar1 & 7 | uVar1 >> 2 & 0xf8;
    if (uVar4 == 0x17) {
      uVar7 = address<(InstructionSet::x86::Source)23,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                        (instruction,(DataPointer)((ushort)(uVar8 << 8) | 0x17),context);
      offset = (uint16_t)uVar7;
    }
    else {
      if (uVar4 != 0x18) {
        push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                  (&(context->registers).cs_,context);
        push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                  (&(context->registers).ip_,context);
        local_3c = 0;
        local_3a = instruction->extensions_[0];
        uVar9 = (ulong)(instruction->mem_exts_source_ >> 4 & 2);
        tVar6 = *(type_conflict2 *)((long)&local_3c + uVar9);
        local_38[0] = 0;
        local_38[1] = *(undefined2 *)((long)instruction->extensions_ + uVar9);
        tVar5 = *(type_conflict2 *)
                 ((long)local_38 + (ulong)(instruction->mem_exts_source_ >> 5 & 2));
        goto LAB_003960ae;
      }
      uVar7 = address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                        (instruction,(DataPointer)((ushort)(uVar8 << 8) | 0x18),context);
      offset = (uint16_t)uVar7;
    }
  }
  segment = (Source)(uVar1 >> 10) & BH | ES;
  tVar5 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,segment,offset);
  tVar6 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,segment,offset + 2);
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
            (&(context->registers).cs_,context);
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
            (&(context->registers).ip_,context);
LAB_003960ae:
  pRVar2 = (context->flow_controller).registers_;
  pRVar2->cs_ = tVar6;
  pSVar3 = (context->flow_controller).segments_;
  pSVar3->cs_base_ = (uint)pSVar3->registers_->cs_ << 4;
  pRVar2->ip_ = tVar5;
  return;
}

Assistant:

void call_far(
	InstructionT &instruction,
	ContextT &context
) {
	// TODO: eliminate 16-bit assumption below.
	const Source source_segment = instruction.data_segment();
	context.memory.preauthorise_stack_write(sizeof(uint16_t) * 2);

	uint16_t source_address;
	const auto pointer = instruction.destination();
	switch(pointer.source()) {
		default:
		case Source::Immediate:
			push<uint16_t, true>(context.registers.cs(), context);
			push<uint16_t, true>(context.registers.ip(), context);
			context.flow_controller.template jump<uint16_t>(instruction.segment(), instruction.offset());
		return;

		case Source::Indirect:
			source_address = uint16_t(address<Source::Indirect, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
		case Source::IndirectNoBase:
			source_address = uint16_t(address<Source::IndirectNoBase, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
		case Source::DirectAddress:
			source_address = uint16_t(address<Source::DirectAddress, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
	}

	context.memory.preauthorise_read(source_segment, source_address, sizeof(uint16_t) * 2);
	const uint16_t offset = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);
	source_address += 2;
	const uint16_t segment = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);

	// At least on an 8086, the stack writes occur after the target address read.
	push<uint16_t, true>(context.registers.cs(), context);
	push<uint16_t, true>(context.registers.ip(), context);

	context.flow_controller.template jump<AddressT>(segment, offset);
}